

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

PaError RealStop(PaAlsaStream *stream,int abort)

{
  char *format;
  PaError threadRes;
  PaError local_c;
  
  if (stream->callbackMode == 0) {
    paUtilErr_ = AlsaStop(stream,abort);
    if (paUtilErr_ < 0) {
      format = 
      "Expression \'AlsaStop( stream, abort )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3111\n"
      ;
      goto LAB_0011364a;
    }
  }
  else {
    stream->callbackAbort = abort;
    paUtilErr_ = PaUnixThread_Terminate(&stream->thread,(uint)(abort == 0),&local_c);
    if (paUtilErr_ < 0) {
      format = 
      "Expression \'PaUnixThread_Terminate( &stream->thread, !abort, &threadRes )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3097\n"
      ;
LAB_0011364a:
      PaUtil_DebugPrint(format);
      return paUtilErr_;
    }
    stream->callback_finished = 0;
  }
  stream->isActive = 0;
  return 0;
}

Assistant:

static PaError RealStop( PaAlsaStream *stream, int abort )
{
    PaError result = paNoError;

    /* First deal with the callback thread, cancelling and/or joining
     * it if necessary
     */
    if( stream->callbackMode )
    {
        PaError threadRes;
        stream->callbackAbort = abort;

        if( !abort )
        {
            PA_DEBUG(( "Stopping callback\n" ));
        }
        PA_ENSURE( PaUnixThread_Terminate( &stream->thread, !abort, &threadRes ) );
        if( threadRes != paNoError )
        {
            PA_DEBUG(( "Callback thread returned: %d\n", threadRes ));
        }
#if 0
        if( watchdogRes != paNoError )
            PA_DEBUG(( "Watchdog thread returned: %d\n", watchdogRes ));
#endif

        stream->callback_finished = 0;
    }
    else
    {
        PA_ENSURE( AlsaStop( stream, abort ) );
    }

    stream->isActive = 0;

end:
    return result;

error:
    goto end;
}